

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O3

void reset_visuals(_Bool load_prefs)

{
  uint8_t uVar1;
  feature *pfVar2;
  monster_race *pmVar3;
  object_kind *poVar4;
  trap_kind_conflict *ptVar5;
  flavor *pfVar6;
  graphics_mode *pgVar7;
  ulong uVar8;
  long lVar9;
  char buf [2014];
  char acStack_7f8 [2024];
  
  if (z_info->f_max != 0) {
    uVar8 = 0;
    do {
      pfVar2 = f_info;
      uVar1 = f_info[uVar8].d_attr;
      lVar9 = 0;
      do {
        *(uint8_t *)(*(long *)((long)feat_x_attr + lVar9) + uVar8) = uVar1;
        *(wchar_t *)(*(long *)((long)feat_x_char + lVar9) + uVar8 * 4) = pfVar2[uVar8].d_char;
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      uVar8 = uVar8 + 1;
    } while (uVar8 < z_info->f_max);
  }
  if (z_info->k_max != 0) {
    lVar9 = 0x8b;
    uVar8 = 0;
    do {
      poVar4 = k_info;
      kind_x_attr[uVar8] = *(uint8_t *)((long)k_info + lVar9 * 4 + -4);
      kind_x_char[uVar8] = *(wchar_t *)(poVar4->flags + lVar9 * 4 + -0x80);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0xb0;
    } while (uVar8 < z_info->k_max);
  }
  if (z_info->r_max != 0) {
    lVar9 = 0x23;
    uVar8 = 0;
    do {
      pmVar3 = r_info;
      monster_x_attr[uVar8] = r_info->flags[lVar9 * 4 + -0x60];
      monster_x_char[uVar8] = *(wchar_t *)(pmVar3->flags + lVar9 * 4 + -0x5c);
      uVar8 = uVar8 + 1;
      lVar9 = lVar9 + 0x34;
    } while (uVar8 < z_info->r_max);
  }
  pfVar6 = flavors;
  if (z_info->trap_max != 0) {
    uVar8 = 0;
    do {
      ptVar5 = trap_info;
      uVar1 = trap_info[uVar8].d_attr;
      lVar9 = 0;
      do {
        *(uint8_t *)(*(long *)((long)trap_x_attr + lVar9) + uVar8) = uVar1;
        *(wchar_t *)(*(long *)((long)trap_x_char + lVar9) + uVar8 * 4) = ptVar5[uVar8].d_char;
        lVar9 = lVar9 + 8;
      } while (lVar9 != 0x20);
      uVar8 = uVar8 + 1;
      pfVar6 = flavors;
    } while (uVar8 < z_info->trap_max);
  }
  for (; pfVar6 != (flavor *)0x0; pfVar6 = pfVar6->next) {
    flavor_x_attr[pfVar6->fidx] = pfVar6->d_attr;
    flavor_x_char[pfVar6->fidx] = pfVar6->d_char;
  }
  if (load_prefs) {
    if (use_graphics == L'\0') {
      process_pref_file("font.prf",false,false);
      return;
    }
    pgVar7 = get_graphics_mode((uint8_t)use_graphics);
    if (pgVar7 == (graphics_mode *)0x0) {
      __assert_fail("mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                    ,0x574,"void reset_visuals(_Bool)");
    }
    path_build(acStack_7f8,0x7de,pgVar7->path,pgVar7->pref);
    process_pref_file_named(acStack_7f8,false,false);
  }
  return;
}

Assistant:

void reset_visuals(bool load_prefs)
{
	int i, j;
	struct flavor *f;

	/* Extract default attr/char code for features */
	for (i = 0; i < z_info->f_max; i++) {
		struct feature *feat = &f_info[i];

		/* Assume we will use the underlying values */
		for (j = 0; j < LIGHTING_MAX; j++) {
			feat_x_attr[j][i] = feat->d_attr;
			feat_x_char[j][i] = feat->d_char;
		}
	}

	/* Extract default attr/char code for objects */
	for (i = 0; i < z_info->k_max; i++) {
		struct object_kind *kind = &k_info[i];

		/* Default attr/char */
		kind_x_attr[i] = kind->d_attr;
		kind_x_char[i] = kind->d_char;
	}

	/* Extract default attr/char code for monsters */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];

		/* Default attr/char */
		monster_x_attr[i] = race->d_attr;
		monster_x_char[i] = race->d_char;
	}

	/* Extract default attr/char code for traps */
	for (i = 0; i < z_info->trap_max; i++) {
		struct trap_kind *trap = &trap_info[i];

		/* Default attr/char */
		for (j = 0; j < LIGHTING_MAX; j++) {
			trap_x_attr[j][i] = trap->d_attr;
			trap_x_char[j][i] = trap->d_char;
		}
	}

	/* Extract default attr/char code for flavors */
	for (f = flavors; f; f = f->next) {
		flavor_x_attr[f->fidx] = f->d_attr;
		flavor_x_char[f->fidx] = f->d_char;
	}

	if (!load_prefs)
		return;

	/* Graphic symbols */
	if (use_graphics) {
		/* if we have a graphics mode, see if the mode has a pref file name */
		graphics_mode *mode = get_graphics_mode(use_graphics);
		char buf[2014];

		assert(mode);

		/* Build path to the pref file */
		path_build(buf, sizeof buf, mode->path, mode->pref);

		process_pref_file_named(buf, false, false);
	} else {
		/* Normal symbols */
		process_pref_file("font.prf", false, false);
	}
}